

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::GetSynchControllersForObjects
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,IPalObject **rgObjects,
          DWORD dwObjectCount,void **ppvControllers,ControllerType ctCtrlrType)

{
  uint uVar1;
  DWORD DVar2;
  int iVar3;
  DWORD DVar4;
  ObjectDomain odObjectDomain;
  undefined4 extraout_var;
  CSynchData *psdSynchData;
  CObjectType *potObjectType;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char cVar5;
  WaitDomain WVar6;
  undefined4 uVar7;
  WaitDomain WVar8;
  ulong uVar9;
  IPalObject **ppIVar10;
  uint uVar11;
  ulong uVar12;
  CPalThread *pCVar13;
  PAL_ERROR PVar14;
  IPalObject **ppIVar15;
  long lVar16;
  CSynchWaitController *local_280;
  anon_union_512_2_150356a7 Ctrlrs;
  CProcProcessLocalData *pProcLocData;
  IDataLock *pDataLock;
  void *pvSData;
  CPalSynchronizationManager *local_60;
  ulong local_58;
  WaitDomain local_50;
  ControllerType local_4c;
  IPalObject **local_48;
  ulong local_40;
  CPalThread *local_38;
  undefined4 extraout_var_00;
  
  if (dwObjectCount - 0x41 < 0xffffffc0) {
    return 0x57;
  }
  local_4c = ctCtrlrType;
  local_48 = rgObjects;
  local_38 = pthrCurrent;
  if (ctCtrlrType == WaitController) {
    uVar1 = CSynchCache<CorUnix::CSynchWaitController>::Get
                      (&this->m_cacheWaitCtrlrs,pthrCurrent,dwObjectCount,&local_280);
    if (dwObjectCount <= uVar1) goto LAB_00139740;
    local_40 = 8;
    uVar11 = 0;
    uVar7 = 1;
LAB_00139985:
    pCVar13 = local_38;
    if (uVar1 <= uVar11) goto LAB_001399c5;
    local_48 = (IPalObject **)CONCAT44(local_48._4_4_,uVar7);
    lVar16 = 0;
    do {
      CSynchCache<CorUnix::CSynchWaitController>::Add
                (&this->m_cacheWaitCtrlrs,pCVar13,(&local_280)[(ulong)uVar11 + lVar16]);
      lVar16 = lVar16 + 1;
    } while (uVar1 - uVar11 != (int)lVar16);
  }
  else {
    uVar1 = CSynchCache<CorUnix::CSynchStateController>::Get
                      (&this->m_cacheStateCtrlrs,pthrCurrent,dwObjectCount,
                       (CSynchStateController **)&local_280);
    if (uVar1 < dwObjectCount) {
      local_40 = 8;
      uVar11 = 0;
      uVar7 = 1;
    }
    else {
LAB_00139740:
      ppIVar15 = local_48;
      pvSData = ppvControllers;
      AcquireLocalSynchLock(pthrCurrent);
      uVar9 = 0;
      DVar2 = 0;
      local_40 = (ulong)dwObjectCount;
      do {
        iVar3 = (*ppIVar15[uVar9]->_vptr_IPalObject[9])();
        DVar4 = DVar2 + (iVar3 == 1);
        if (((iVar3 == 1) + DVar2) - 1 < uVar9) {
          WVar6 = MixedWait;
          goto LAB_0013978d;
        }
        uVar9 = uVar9 + 1;
        DVar2 = DVar4;
      } while (local_40 != uVar9);
      WVar6 = LocalWait;
LAB_0013978d:
      WVar8 = SharedWait;
      if (DVar4 != dwObjectCount) {
        WVar8 = WVar6;
      }
      local_58 = (ulong)dwObjectCount;
      odObjectDomain = (*(*ppIVar15)->_vptr_IPalObject[9])();
      iVar3 = (*(*ppIVar15)->_vptr_IPalObject[10])(*ppIVar15,&pDataLock);
      uVar9 = CONCAT44(extraout_var,iVar3);
      if (iVar3 == 0) {
        uVar12 = 0;
        local_60 = this;
        local_50 = WVar8;
        do {
          psdSynchData = (CSynchData *)pDataLock;
          if (odObjectDomain == SharedObject) {
            psdSynchData = (CSynchData *)SHMPtrToPtr((SHMPTR)pDataLock);
          }
          iVar3 = (**(*ppIVar15)->_vptr_IPalObject)();
          potObjectType = (CObjectType *)CONCAT44(extraout_var_00,iVar3);
          if (local_4c == WaitController) {
            CSynchControllerBase::Init
                      (&(&local_280)[uVar12]->super_CSynchControllerBase,local_38,WaitController,
                       odObjectDomain,potObjectType,psdSynchData,local_50);
            pCVar13 = local_38;
            ppIVar10 = local_48;
            if (potObjectType->m_eTypeId == otiProcess) {
              iVar3 = (*(*ppIVar15)->_vptr_IPalObject[3])
                                (*ppIVar15,local_38,0,&pProcLocData,Ctrlrs.pWaitCtrlrs + 0x3f);
              uVar9 = CONCAT44(extraout_var_01,iVar3);
              if (iVar3 != 0) {
                uVar12 = (ulong)((int)uVar12 + 1);
                this = local_60;
                goto LAB_00139904;
              }
              CSynchWaitController::SetProcessLocalData
                        ((&local_280)[uVar12],(CProcProcessLocalData *)Ctrlrs.pWaitCtrlrs[0x3f]);
              (*(code *)**(undefined8 **)pProcLocData)(pProcLocData,pCVar13,0);
            }
            if (uVar12 + 1 != local_40) goto LAB_001398a4;
            if (local_4c != WaitController) goto LAB_001399f4;
            uVar9 = 0;
            do {
              *(CSynchWaitController **)((long)pvSData + uVar9 * 8) = (&local_280)[uVar9];
              uVar9 = uVar9 + 1;
            } while (local_40 != uVar9);
LAB_00139a11:
            PVar14 = 0;
            pCVar13 = local_38;
            goto LAB_001399d1;
          }
          CSynchControllerBase::Init
                    (&(&local_280)[uVar12]->super_CSynchControllerBase,local_38,local_4c,
                     odObjectDomain,potObjectType,psdSynchData,local_50);
          ppIVar10 = local_48;
          if (uVar12 + 1 == local_40) {
LAB_001399f4:
            uVar9 = 0;
            do {
              *(CSynchWaitController **)((long)pvSData + uVar9 * 8) = (&local_280)[uVar9];
              uVar9 = uVar9 + 1;
            } while (local_40 != uVar9);
            goto LAB_00139a11;
          }
LAB_001398a4:
          uVar12 = uVar12 + 1;
          ppIVar15 = ppIVar10 + uVar12;
          odObjectDomain = (*(*ppIVar15)->_vptr_IPalObject[9])();
          iVar3 = (*(*ppIVar15)->_vptr_IPalObject[10])(*ppIVar15,&pDataLock);
          uVar9 = CONCAT44(extraout_var_02,iVar3);
          this = local_60;
        } while (iVar3 == 0);
      }
      else {
        uVar12 = 0;
      }
      if (local_4c == WaitController) {
        if (uVar12 == 0) {
          local_40 = uVar9;
          uVar11 = 0;
        }
        else {
LAB_00139904:
          uVar11 = (uint)uVar12;
          local_40 = uVar9;
          uVar9 = 0;
          do {
            CSynchControllerBase::Release(&(&local_280)[uVar9]->super_CSynchControllerBase);
            uVar9 = uVar9 + 1;
          } while ((uVar12 & 0xffffffff) != uVar9);
        }
        uVar7 = 0;
        uVar1 = (uint)local_58;
        goto LAB_00139985;
      }
      local_40 = uVar9;
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        uVar9 = 0;
        do {
          CSynchControllerBase::Release(&(&local_280)[uVar9]->super_CSynchControllerBase);
          uVar9 = uVar9 + 1;
        } while ((uVar12 & 0xffffffff) != uVar9);
      }
      uVar7 = 0;
      uVar11 = (uint)uVar12;
      uVar1 = (uint)local_58;
    }
    pCVar13 = local_38;
    if (uVar1 <= uVar11) {
LAB_001399c5:
      cVar5 = (char)uVar7;
      pCVar13 = local_38;
      goto LAB_001399c9;
    }
    local_48 = (IPalObject **)CONCAT44(local_48._4_4_,uVar7);
    lVar16 = 0;
    do {
      CSynchCache<CorUnix::CSynchStateController>::Add
                (&this->m_cacheStateCtrlrs,pCVar13,
                 (CSynchStateController *)(&local_280)[(ulong)uVar11 + lVar16]);
      lVar16 = lVar16 + 1;
    } while (uVar1 - uVar11 != (int)lVar16);
  }
  cVar5 = (char)local_48;
LAB_001399c9:
  PVar14 = (PAL_ERROR)local_40;
  if (cVar5 == '\0') {
LAB_001399d1:
    ReleaseLocalSynchLock(pCVar13);
  }
  return PVar14;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetSynchControllersForObjects(
        CPalThread *pthrCurrent,
        IPalObject *rgObjects[],
        DWORD dwObjectCount,
        void ** ppvControllers,
        CSynchControllerBase::ControllerType ctCtrlrType)
    {
        PAL_ERROR palErr = NO_ERROR;
        unsigned int uIdx, uCount = 0, uSharedObjectCount = 0;
        WaitDomain wdWaitDomain = LocalWait;
        CObjectType * potObjectType = NULL;
        unsigned int uErrCleanupIdxFirstNotInitializedCtrlr = 0;
        unsigned int uErrCleanupIdxLastCtrlr = 0;
        bool fLocalSynchLock = false;
        union
        {
            CSynchWaitController * pWaitCtrlrs[MAXIMUM_WAIT_OBJECTS];
            CSynchStateController * pStateCtrlrs[MAXIMUM_WAIT_OBJECTS];
        } Ctrlrs;

        if ((dwObjectCount <= 0) || (dwObjectCount > MAXIMUM_WAIT_OBJECTS))
        {
            palErr = ERROR_INVALID_PARAMETER;
            goto GSCFO_exit;
        }

        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            uCount = (unsigned int)m_cacheWaitCtrlrs.Get(pthrCurrent,
                                                         dwObjectCount,
                                                         Ctrlrs.pWaitCtrlrs);
        }
        else
        {
            uCount = (unsigned int)m_cacheStateCtrlrs.Get(pthrCurrent,
                                                          dwObjectCount,
                                                          Ctrlrs.pStateCtrlrs);
        }
        if (uCount < dwObjectCount)
        {
            // We got less controllers (uCount) than we asked for (dwObjectCount),
            // probably because of low memory.
            // None of these controllers is initialized, so they must be all
            // returned directly to the cache
            uErrCleanupIdxLastCtrlr = uCount;

            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto GSCFO_error_cleanup;
        }

        //
        // We need to acquire the local synch lock before evaluating object
        // domains
        //
        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        for (uIdx=0; uIdx<dwObjectCount; uIdx++)
        {
            if (SharedObject == rgObjects[uIdx]->GetObjectDomain())
            {
                ++uSharedObjectCount;
            }
            if (uSharedObjectCount > 0 && uSharedObjectCount <= uIdx)
            {
                wdWaitDomain = MixedWait;
                break;
            }
        }
        if (dwObjectCount == uSharedObjectCount)
        {
            wdWaitDomain = SharedWait;
        }

        for (uIdx=0;uIdx<dwObjectCount;uIdx++)
        {
            void * pvSData;
            CSynchData * psdSynchData;
            ObjectDomain odObjectDomain = rgObjects[uIdx]->GetObjectDomain();

            palErr = rgObjects[uIdx]->GetObjectSynchData((void **)&pvSData);
            if (NO_ERROR != palErr)
            {
                break;
            }

            psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
                CSynchData, reinterpret_cast<SharedID>(pvSData)) :
                static_cast<CSynchData *>(pvSData);

            VALIDATEOBJECT(psdSynchData);

            potObjectType = rgObjects[uIdx]->GetObjectType();


            if (CSynchControllerBase::WaitController == ctCtrlrType)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Init(pthrCurrent,
                                            ctCtrlrType,
                                            odObjectDomain,
                                            potObjectType,
                                            psdSynchData,
                                            wdWaitDomain);
            }
            else
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Init(pthrCurrent,
                                             ctCtrlrType,
                                             odObjectDomain,
                                             potObjectType,
                                             psdSynchData,
                                             wdWaitDomain);
            }

            if (CSynchControllerBase::WaitController == ctCtrlrType &&
                otiProcess == potObjectType->GetId())
            {
                CProcProcessLocalData * pProcLocData;
                IDataLock * pDataLock;

                palErr = rgObjects[uIdx]->GetProcessLocalData(
                    pthrCurrent,
                    ReadLock,
                    &pDataLock,
                    (void **)&pProcLocData);
                if (NO_ERROR != palErr)
                {
                    // In case of failure here, bail out of the loop, but
                    // keep track (by incrementing the counter 'uIdx') of the
                    // fact that this controller has already being initialized
                    // and therefore need to be Release'd rather than just
                    // returned to the cache
                    uIdx++;
                    break;
                }

                Ctrlrs.pWaitCtrlrs[uIdx]->SetProcessLocalData(pProcLocData);
                pDataLock->ReleaseLock(pthrCurrent, false);
            }
        }
        if (NO_ERROR != palErr)
        {
            // An error occurred while initializing the (uIdx+1)-th controller,
            // i.e. the one at index uIdx; therefore the first uIdx controllers
            // must be Release'd, while the remaining uCount-uIdx must be returned
            // directly to the cache.
            uErrCleanupIdxFirstNotInitializedCtrlr = uIdx;
            uErrCleanupIdxLastCtrlr = dwObjectCount;

            goto GSCFO_error_cleanup;
        }

        // Succeeded
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // The multiple cast is NEEDED, though currently it does not
                // change the value ot the pointer. Anyway, if in the future
                // a virtual method should be added to the base class
                // CSynchControllerBase, both derived classes would have two
                // virtual tables, therefore a static cast from, for instance,
                // a CSynchWaitController* to a ISynchWaitController* would
                // return the given pointer incremented by the size of a
                // generic pointer on the specific platform

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchWaitController *>(Ctrlrs.pWaitCtrlrs[uIdx]));
            }
        }
        else
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // See comment above

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchStateController *>(Ctrlrs.pStateCtrlrs[uIdx]));
            }
        }

        // Succeeded: skip error cleanup
        goto GSCFO_exit;

    GSCFO_error_cleanup:
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            // Release already initialized wait controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized wait controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheWaitCtrlrs.Add(pthrCurrent, Ctrlrs.pWaitCtrlrs[uIdx]);
            }
        }
        else
        {
            // Release already initialized state controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized state controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheStateCtrlrs.Add(pthrCurrent, Ctrlrs.pStateCtrlrs[uIdx]);
            }
        }

    GSCFO_exit:

        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        return palErr;
    }